

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index.h
# Opt level: O1

void __thiscall S2ShapeIndex::Iterator::Init(Iterator *this,S2ShapeIndex *index,InitialPosition pos)

{
  _Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false> _Var1;
  _Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false> _Var2;
  IteratorBase *in_RAX;
  pointer *__ptr;
  _Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false> local_18;
  
  local_18._M_head_impl = in_RAX;
  (*index->_vptr_S2ShapeIndex[6])(&local_18);
  _Var2._M_head_impl = local_18._M_head_impl;
  local_18._M_head_impl = (IteratorBase *)0x0;
  _Var1._M_head_impl =
       (this->iter_)._M_t.
       super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
       ._M_t.
       super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
       .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl;
  (this->iter_)._M_t.
  super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
  .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (IteratorBase *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_IteratorBase + 8))();
  }
  if (local_18._M_head_impl != (IteratorBase *)0x0) {
    (*(local_18._M_head_impl)->_vptr_IteratorBase[1])();
  }
  return;
}

Assistant:

void Init(const S2ShapeIndex* index,
              InitialPosition pos = UNPOSITIONED) {
      iter_ = index->NewIterator(pos);
    }